

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O1

int YP_md_set_joint_accel(YPSpur *spur,int id,double a)

{
  int iVar1;
  int iVar2;
  YPSpur_msg msg;
  YPSpur_msg local_40;
  
  local_40.msg_type = 1;
  local_40.pid = (long)spur->pid;
  local_40.type = 0x810;
  local_40.cs = id;
  local_40.data[0] = a;
  iVar1 = (*(spur->dev).send)(&spur->dev,&local_40);
  iVar2 = 1;
  if (iVar1 < 0) {
    spur->connection_error = 1;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int YP_md_set_joint_accel(YPSpur* spur, int id, double a)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_SET_JOINT_ACCEL;
  msg.cs = id;
  msg.data[0] = a;

  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  return 1;
}